

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

type_t pugi::impl::anon_unknown_0::xpath_sort
                 (xpath_node *begin,xpath_node *end,type_t type,bool rev)

{
  xpath_node *lhs;
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  type_t tVar7;
  undefined7 in_register_00000009;
  undefined4 extraout_EDX;
  undefined4 uVar8;
  undefined4 extraout_EDX_00;
  uint in_register_00000014;
  undefined4 extraout_var;
  undefined4 uVar9;
  undefined4 extraout_var_00;
  xpath_node *pxVar10;
  
  tVar7 = (int)CONCAT71(in_register_00000009,rev) + type_sorted;
  if ((type == type_unsorted) && (type = type_sorted, 0x10 < (long)end - (long)begin)) {
    bVar4 = document_order_comparator::operator()
                      ((document_order_comparator *)begin,begin + 1,
                       (xpath_node *)((ulong)in_register_00000014 << 0x20));
    uVar8 = extraout_EDX;
    uVar9 = extraout_var;
    pxVar10 = begin + 1;
    do {
      lhs = pxVar10 + 1;
      if (end <= lhs) {
        type = type_sorted_reverse - bVar4;
        goto LAB_00115650;
      }
      bVar5 = document_order_comparator::operator()
                        ((document_order_comparator *)pxVar10,lhs,
                         (xpath_node *)CONCAT44(uVar9,uVar8));
      uVar8 = extraout_EDX_00;
      uVar9 = extraout_var_00;
      pxVar10 = lhs;
    } while (bVar4 == bVar5);
    (anonymous_namespace)::
    sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
              (begin,end,(document_order_comparator *)CONCAT44(extraout_var_00,extraout_EDX_00));
  }
LAB_00115650:
  if (type != tVar7) {
    lVar6 = (long)end - (long)begin;
    for (; pxVar10 = end + -1, 0x10 < lVar6; lVar6 = lVar6 + -0x20) {
      pxVar1 = (begin->_node)._root;
      pxVar2 = (begin->_attribute)._attr;
      pxVar3 = end[-1]._attribute._attr;
      (begin->_node)._root = (pxVar10->_node)._root;
      (begin->_attribute)._attr = pxVar3;
      begin = begin + 1;
      (pxVar10->_node)._root = pxVar1;
      end[-1]._attribute._attr = pxVar2;
      end = pxVar10;
    }
  }
  return tVar7;
}

Assistant:

PUGI__FN xpath_node_set::type_t xpath_sort(xpath_node* begin, xpath_node* end, xpath_node_set::type_t type, bool rev)
	{
		xpath_node_set::type_t order = rev ? xpath_node_set::type_sorted_reverse : xpath_node_set::type_sorted;

		if (type == xpath_node_set::type_unsorted)
		{
			xpath_node_set::type_t sorted = xpath_get_order(begin, end);

			if (sorted == xpath_node_set::type_unsorted)
			{
				sort(begin, end, document_order_comparator());

				type = xpath_node_set::type_sorted;
			}
			else
				type = sorted;
		}

		if (type != order) reverse(begin, end);

		return order;
	}